

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O3

int binbuf_read(_binbuf *b,char *filename,char *dirname,int crflag)

{
  int i;
  uint __fd;
  size_t nbytes;
  __off_t _Var1;
  char *text;
  ulong uVar2;
  size_t sVar3;
  char namebuf [1000];
  char acStack_418 [999];
  undefined1 local_31;
  
  if (*dirname == '\0') {
    snprintf(acStack_418,999,"%s",filename);
  }
  else {
    snprintf(acStack_418,999,"%s/%s",dirname);
  }
  local_31 = 0;
  __fd = sys_open(acStack_418,0);
  if ((int)__fd < 0) {
    binbuf_read_cold_2();
  }
  else {
    nbytes = lseek(__fd,0,2);
    if ((((long)nbytes < 0) || (_Var1 = lseek(__fd,0,0), _Var1 < 0)) ||
       (text = (char *)getbytes(nbytes), text == (char *)0x0)) {
      binbuf_read_cold_1();
    }
    else {
      uVar2 = read(__fd,text,nbytes);
      if ((long)nbytes <= (long)(int)uVar2) {
        if (nbytes != 0 && crflag != 0) {
          sVar3 = 0;
          do {
            if (text[sVar3] == '\n') {
              text[sVar3] = ';';
            }
            sVar3 = sVar3 + 1;
          } while (nbytes != sVar3);
        }
        binbuf_text(b,text,nbytes);
        freebytes(text,nbytes);
        close(__fd);
        return 0;
      }
      fprintf(_stderr,"read (%d %ld) -> %d\n",(ulong)__fd,nbytes,uVar2 & 0xffffffff);
      perror(acStack_418);
      close(__fd);
      freebytes(text,nbytes);
    }
  }
  return 1;
}

Assistant:

int binbuf_read(t_binbuf *b, const char *filename, const char *dirname, int crflag)
{
    long length;
    int fd;
    int readret;
    char *buf;
    char namebuf[MAXPDSTRING];

    if (*dirname)
        snprintf(namebuf, MAXPDSTRING-1, "%s/%s", dirname, filename);
    else
        snprintf(namebuf, MAXPDSTRING-1, "%s", filename);
    namebuf[MAXPDSTRING-1] = 0;

    if ((fd = sys_open(namebuf, 0)) < 0)
    {
        fprintf(stderr, "open: ");
        perror(namebuf);
        return (1);
    }
    if ((length = (long)lseek(fd, 0, SEEK_END)) < 0 || lseek(fd, 0, SEEK_SET) < 0
        || !(buf = t_getbytes(length)))
    {
        fprintf(stderr, "lseek: ");
        perror(namebuf);
        close(fd);
        return(1);
    }
    if ((readret = (int)read(fd, buf, length)) < length)
    {
        fprintf(stderr, "read (%d %ld) -> %d\n", fd, length, readret);
        perror(namebuf);
        close(fd);
        t_freebytes(buf, length);
        return(1);
    }
        /* optionally map carriage return to semicolon */
    if (crflag)
    {
        int i;
        for (i = 0; i < length; i++)
            if (buf[i] == '\n')
                buf[i] = ';';
    }
    binbuf_text(b, buf, length);

#if 0
    startpost("binbuf_read "); postatom(b->b_n, b->b_vec); endpost();
#endif

    t_freebytes(buf, length);
    close(fd);
    return (0);
}